

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void wabt::anon_unknown_0::CWriter::SerializeFuncType(FuncType *func_type,string *serialized_type)

{
  Type TVar1;
  long lVar2;
  char cVar3;
  pointer pTVar4;
  string *digest;
  ulong uVar5;
  string *psVar6;
  ulong uVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  wabt *this;
  string_view input;
  undefined8 uStack_40;
  undefined8 local_38;
  
  digest = (string *)
           (func_type->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(func_type->sig).param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)digest;
  pTVar4 = (func_type->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(func_type->sig).result_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar4;
  this = (wabt *)(ulong)((int)(uVar7 >> 3) + (int)(uVar5 >> 3) + 1);
  lVar2 = -((ulong)(this + 0xf) & 0xfffffffffffffff0);
  puVar8 = (undefined1 *)((long)&local_38 + lVar2);
  puVar9 = puVar8;
  local_38 = serialized_type;
  if ((uVar7 & 0x7fffffff8) != 0) {
    uVar7 = 0;
    do {
      TVar1 = *(Type *)(&digest->_M_dataplus + uVar7);
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x13fc87;
      cVar3 = MangleType(TVar1);
      puVar8[uVar7] = cVar3;
      uVar7 = uVar7 + 1;
      digest = (string *)
               (func_type->sig).param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < ((ulong)((long)(func_type->sig).param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)digest) >> 3 &
                     0xffffffff));
    pTVar4 = (func_type->sig).result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(func_type->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar4;
    puVar9 = puVar8 + uVar7;
  }
  *puVar9 = 0x20;
  puVar9 = puVar9 + 1;
  if ((uVar5 & 0x7fffffff8) != 0) {
    psVar6 = (string *)0x0;
    do {
      TVar1 = pTVar4[(long)psVar6];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x13fcca;
      cVar3 = MangleType(TVar1);
      puVar9[(long)psVar6] = cVar3;
      psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
      pTVar4 = (func_type->sig).result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      digest = (string *)
               ((ulong)((long)(func_type->sig).result_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pTVar4) >> 3 & 0xffffffff);
    } while (psVar6 < digest);
    puVar9 = puVar9 + (long)psVar6;
  }
  psVar6 = local_38;
  if ((wabt *)(puVar9 + -(long)puVar8) == this) {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x13fd02;
    input._M_str = (char *)psVar6;
    input._M_len = (size_t)puVar8;
    sha256(this,input,digest);
    return;
  }
  *(code **)((long)&uStack_40 + lVar2) = (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_;
  __assert_fail("next_byte - mangled_signature == len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x558,
                "static void wabt::(anonymous namespace)::CWriter::SerializeFuncType(const FuncType &, std::string &)"
               );
}

Assistant:

void CWriter::SerializeFuncType(const FuncType& func_type,
                                std::string& serialized_type) {
  unsigned int len = func_type.GetNumParams() + func_type.GetNumResults() + 1;

  char* const mangled_signature = static_cast<char*>(alloca(len));
  char* next_byte = mangled_signature;

  // step 1: serialize each param type
  for (Index i = 0; i < func_type.GetNumParams(); ++i) {
    *next_byte++ = MangleType(func_type.GetParamType(i));
  }

  // step 2: separate params and results with a space
  *next_byte++ = ' ';

  // step 3: serialize each result type
  for (Index i = 0; i < func_type.GetNumResults(); ++i) {
    *next_byte++ = MangleType(func_type.GetResultType(i));
  }

  assert(next_byte - mangled_signature == len);

  // step 4: SHA-256 the whole string
  sha256({mangled_signature, len}, serialized_type);
}